

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::
OP_SimdShuffleV8X16<Js::OpLayoutT_AsmShuffle<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_AsmShuffle<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout)

{
  unsigned_short localRegisterID;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  AsmJsSIMDValue src1;
  AsmJsSIMDValue src2;
  SIMDValue bValue;
  uint local_5c;
  uint32 local_58;
  uint32 i;
  uint32 lanes [16];
  OpLayoutT_AsmShuffle<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout_local;
  InterpreterStackFrame *this_local;
  
  local_5c = 0;
  lanes._56_8_ = playout;
  do {
    if (0xf < local_5c) {
      localRegisterID = *(unsigned_short *)(lanes._56_8_ + 0x10);
      src1 = GetRegRawSimd<unsigned_short>(this,*(unsigned_short *)(lanes._56_8_ + 0x12));
      src2 = GetRegRawSimd<unsigned_short>(this,*(unsigned_short *)(lanes._56_8_ + 0x14));
      bValue = SIMDUtils::SIMD128InnerShuffle
                         ((SIMDValue)src1.field_0,(SIMDValue)src2.field_0,0x10,&local_58);
      SetRegRawSimd<unsigned_short>(this,localRegisterID,(AsmJsSIMDValue)bValue.field_0);
      return;
    }
    if (0x1f < *(byte *)(lanes._56_8_ + (ulong)local_5c)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                  ,0x20d5,"(playout->INDICES[i] < Wasm::Simd::MAX_LANES * 2)",
                                  "playout->INDICES[i] < Wasm::Simd::MAX_LANES * 2");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    (&local_58)[local_5c] = (uint)*(byte *)(lanes._56_8_ + (ulong)local_5c);
    local_5c = local_5c + 1;
  } while( true );
}

Assistant:

void InterpreterStackFrame::OP_SimdShuffleV8X16(const unaligned T* playout)
    {
        uint32 lanes[Wasm::Simd::MAX_LANES];
        for (uint32 i = 0; i < Wasm::Simd::MAX_LANES; i++)
        {
            Assert(playout->INDICES[i] < Wasm::Simd::MAX_LANES * 2);
            lanes[i] = playout->INDICES[i];
        }
        SetRegRawSimd(playout->R0, SIMDUtils::SIMD128InnerShuffle(GetRegRawSimd(playout->R1), GetRegRawSimd(playout->R2), Wasm::Simd::MAX_LANES, lanes));
    }